

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3889::StatePointer_CopyAssignment_Test::TestBody
          (StatePointer_CopyAssignment_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_58 [3];
  Message local_40;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p2;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p1;
  Foo foo;
  StatePointer_CopyAssignment_Test *this_local;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            (&p2,(pointer_type)((long)&p1.m_ptr_and_state + 4),1);
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&gtest_ar.message_,
             (nullptr_t)0x0,0);
  testing::internal::
  CmpHelperNE<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            ((internal *)local_38,"p1","p2",&p2,
             (state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    testing::Message::~Message(&local_40);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p2.m_ptr_and_state;
    testing::internal::EqHelper<false>::
    Compare<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
              ((EqHelper<false> *)local_70,"p1","p2",&p2,
               (state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&gtest_ar.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar1) {
      testing::Message::Message(&local_78);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
      testing::internal::AssertHelper::AssertHelper
                (&local_80,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
                 ,0x4f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_80,&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_80);
      testing::Message::~Message(&local_78);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  }
  return;
}

Assistant:

TEST(StatePointer, CopyAssignment) {
	Foo foo;
	state_ptr<Foo> p1{&foo, 1};
	state_ptr<Foo> p2{nullptr, 0};
	ASSERT_NE(p1, p2);
	p2 = p1;
	ASSERT_EQ(p1, p2);
}